

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_casetab.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  size_t i;
  char *pcVar5;
  ulong uVar6;
  size_t i_1;
  ulong uVar7;
  size_t i_3;
  allocator<char> local_8d9;
  vector<codept,_std::allocator<codept>_> tab;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields_1;
  codept code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  ofstream out;
  uint auStack_830 [124];
  ifstream in;
  byte abStack_620 [488];
  char line [1024];
  
  tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  code.descr._M_dataplus._M_p = (pointer)&code.descr.field_2;
  code.descr._M_string_length = 0;
  code.descr.field_2._M_local_buf[0] = '\0';
  puts("gen_casetab running. Command line is:");
  uVar7 = 0;
  if (0 < argc) {
    uVar7 = (ulong)(uint)argc;
  }
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    printf("`%s` ",argv[uVar6]);
  }
  putchar(10);
  if (argc < 2) {
    fwrite("Usage: gen_casetab <input table> <output folder>\n",0x31,1,_stderr);
  }
  else {
    std::ifstream::ifstream(&in,argv[1],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      puts("Starting...");
      while ((abStack_620[*(long *)(_in + -0x18)] & 5) == 0) {
        _out = (undefined8 *)0x0;
        std::istream::getline((char *)&in,(long)line);
        if ((0x23 < (ulong)(byte)line[0]) ||
           ((0x800002001U >> ((ulong)(byte)line[0] & 0x3f) & 1) == 0)) {
          bVar2 = parse(line,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&out);
          if (bVar2) {
            if (_out[0x35] != 0) {
              lVar3 = strtol((char *)*_out,(char **)0x0,0x10);
              code.uc = (int)lVar3;
              lVar3 = strtol((char *)_out[0x34],(char **)0x0,0x10);
              code.lc = (int)lVar3;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&code.descr,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (_out + 4));
              std::vector<codept,_std::allocator<codept>_>::push_back(&tab,&code);
            }
          }
          else {
            printf("Cannot parse line:\n%s\n",line);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&out);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,argv[2],&local_8d9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fields_1,
                     &local_868,"/uppertab.h");
      std::ofstream::ofstream(&out,(string *)&fields_1,_S_out);
      std::__cxx11::string::~string((string *)&fields_1);
      std::__cxx11::string::~string((string *)&local_868);
      poVar4 = std::operator<<((ostream *)&out,"//Upper case table");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"static const char32_t u2l [");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"] = { ");
      std::endl<char,std::char_traits<char>>(poVar4);
      *(uint *)((long)auStack_830 + _out[-3]) =
           *(uint *)((long)auStack_830 + _out[-3]) & 0xffffffb5 | 8;
      lVar3 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)(((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x28); uVar7 = uVar7 + 1) {
        poVar4 = std::operator<<((ostream *)&out,"  0x");
        poVar4 = std::operator<<(poVar4,0x30);
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
        std::ostream::operator<<
                  (poVar4,*(int *)((long)&(tab.super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->uc + lVar3));
        pcVar5 = "};";
        if (uVar7 != ((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x28 - 1U) {
          pcVar5 = ", ";
        }
        std::operator<<((ostream *)&out,pcVar5);
        poVar4 = std::operator<<((ostream *)&out,"// ");
        poVar4 = std::operator<<(poVar4,*(char **)((long)&((tab.
                                                  super__Vector_base<codept,_std::allocator<codept>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->descr)
                                                  ._M_dataplus._M_p + lVar3));
        std::endl<char,std::char_traits<char>>(poVar4);
        lVar3 = lVar3 + 0x28;
      }
      *(uint *)((long)auStack_830 + _out[-3]) =
           *(uint *)((long)auStack_830 + _out[-3]) & 0xffffffb5 | 2;
      std::endl<char,std::char_traits<char>>((ostream *)&out);
      poVar4 = std::operator<<((ostream *)&out,"//Lower case equivalents");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"static const char32_t lc [");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"] = { ");
      *(uint *)((long)auStack_830 + _out[-3]) =
           *(uint *)((long)auStack_830 + _out[-3]) & 0xffffffb5 | 8;
      lVar3 = 4;
      for (uVar7 = 0;
          uVar7 < (ulong)(((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x28); uVar7 = uVar7 + 1) {
        if ((uVar7 & 7) == 0) {
          poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&out);
          std::operator<<(poVar4,"  ");
        }
        poVar4 = std::operator<<((ostream *)&out,"0x");
        poVar4 = std::operator<<(poVar4,0x30);
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
        std::ostream::operator<<
                  (poVar4,*(int *)((long)&(tab.super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->uc + lVar3));
        pcVar5 = "};";
        if (uVar7 != ((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x28 - 1U) {
          pcVar5 = ", ";
        }
        std::operator<<((ostream *)&out,pcVar5);
        lVar3 = lVar3 + 0x28;
      }
      std::ofstream::close();
      std::ios::clear((int)&in + (int)*(undefined8 *)(_in + -0x18));
      std::istream::seekg(&in,0,0);
      std::vector<codept,_std::allocator<codept>_>::clear(&tab);
      while ((abStack_620[*(long *)(_in + -0x18)] & 5) == 0) {
        fields_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fields_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fields_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::istream::getline((char *)&in,(long)line);
        if ((0x23 < (ulong)(byte)line[0]) ||
           ((0x800002001U >> ((ulong)(byte)line[0] & 0x3f) & 1) == 0)) {
          parse(line,&fields_1);
          if (fields_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0xc]._M_string_length != 0) {
            lVar3 = strtol(fields_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[0xc]._M_dataplus._M_p,
                           (char **)0x0,0x10);
            code.uc = (int)lVar3;
            lVar3 = strtol(((fields_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                           (char **)0x0,0x10);
            code.lc = (int)lVar3;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&code.descr,
                      fields_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
            std::vector<codept,_std::allocator<codept>_>::push_back(&tab,&code);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&fields_1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,argv[2],&local_8d9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fields_1,
                     &local_868,"/lowertab.h");
      std::ofstream::open((string *)&out,(_Ios_Openmode)&fields_1);
      std::__cxx11::string::~string((string *)&fields_1);
      std::__cxx11::string::~string((string *)&local_868);
      poVar4 = std::operator<<((ostream *)&out,"//Lower case table");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"static const char32_t l2u [");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"] = { ");
      std::endl<char,std::char_traits<char>>(poVar4);
      *(uint *)((long)auStack_830 + _out[-3]) =
           *(uint *)((long)auStack_830 + _out[-3]) & 0xffffffb5 | 8;
      lVar3 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)(((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x28); uVar7 = uVar7 + 1) {
        poVar4 = std::operator<<((ostream *)&out,"  0x");
        poVar4 = std::operator<<(poVar4,0x30);
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
        std::ostream::operator<<
                  (poVar4,*(int *)((long)&(tab.super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->lc + lVar3));
        pcVar5 = "};";
        if (uVar7 != ((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x28 - 1U) {
          pcVar5 = ", ";
        }
        std::operator<<((ostream *)&out,pcVar5);
        poVar4 = std::operator<<((ostream *)&out,"// ");
        poVar4 = std::operator<<(poVar4,*(char **)((long)&((tab.
                                                  super__Vector_base<codept,_std::allocator<codept>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->descr)
                                                  ._M_dataplus._M_p + lVar3));
        std::endl<char,std::char_traits<char>>(poVar4);
        lVar3 = lVar3 + 0x28;
      }
      *(uint *)((long)auStack_830 + _out[-3]) =
           *(uint *)((long)auStack_830 + _out[-3]) & 0xffffffb5 | 2;
      std::endl<char,std::char_traits<char>>((ostream *)&out);
      poVar4 = std::operator<<((ostream *)&out,"//Upper case equivalents");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"static const char32_t uc [");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"] = { ");
      std::endl<char,std::char_traits<char>>(poVar4);
      *(uint *)((long)auStack_830 + _out[-3]) =
           *(uint *)((long)auStack_830 + _out[-3]) & 0xffffffb5 | 8;
      lVar3 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)(((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x28); uVar7 = uVar7 + 1) {
        if ((uVar7 & 7) == 0) {
          poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&out);
          std::operator<<(poVar4,"  ");
        }
        poVar4 = std::operator<<((ostream *)&out,"0x");
        poVar4 = std::operator<<(poVar4,0x30);
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
        std::ostream::operator<<
                  (poVar4,*(int *)((long)&(tab.super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->uc + lVar3));
        pcVar5 = "};";
        if (uVar7 != ((long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x28 - 1U) {
          pcVar5 = ", ";
        }
        std::operator<<((ostream *)&out,pcVar5);
        lVar3 = lVar3 + 0x28;
      }
      std::ofstream::close();
      std::ifstream::close();
      std::ofstream::~ofstream(&out);
      std::ifstream::~ifstream(&in);
      std::__cxx11::string::~string((string *)&code.descr);
      std::vector<codept,_std::allocator<codept>_>::~vector(&tab);
      return 0;
    }
    fprintf(_stderr,"gen_casetab: cannot open input table: %s\n",argv[1]);
  }
  exit(1);
}

Assistant:

int main (int argc, char **argv)
{
  char line[1024];
  vector<codept> tab;

  codept code;
  printf ("gen_casetab running. Command line is:\n");
  for (int i = 0; i < argc; i++)
  {
    printf ("`%s` ", argv[i]);
  }
  printf ("\n");

  if (argc < 2)
  {
    fprintf (stderr, "Usage: gen_casetab <input table> <output folder>\n");
    exit (1);
  }
  ifstream in (argv[1]);

  if (!in.is_open ())
  {
    fprintf (stderr, "gen_casetab: cannot open input table: %s\n", argv[1]);
    exit (1);
  }
  printf ("Starting...\n");

  //Generate upper case -> lower case table
  while (in)
  {
    vector<string> fields;
    in.getline (line, sizeof (line));
    // printf ("%s\n", line);
    if (!strlen(line) || line[0] == '#' || line[0] == '\r')
      continue; //ignore empty and comment lines
    if (!parse (line, fields))
    {
      printf ("Cannot parse line:\n%s\n", line);
      continue;
    }
    if (fields[LC_FIELD].empty ())
      continue;

    code.uc = strtol (fields[CODE_FIELD].c_str(), nullptr, 16);
    code.lc = strtol (fields[LC_FIELD].c_str(), nullptr, 16);
    code.descr = fields[DESCR_FIELD];
    tab.push_back (code);
  }

  ofstream out (string(argv[2]) + "/uppertab.h");
  out << "//Upper case table" << endl
    << "static const char32_t u2l [" << tab.size() << "] = { " << endl;
  out << hex;
  for (size_t i=0; i<tab.size(); i++)
  {
    out << "  0x" << std::setfill ('0') << std::setw (5) << tab[i].uc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
    out << "// " << tab[i].descr.c_str() << endl;
  }
  out << dec << endl;
  out << "//Lower case equivalents" << endl
    << "static const char32_t lc [" << tab.size () << "] = { ";
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    if (i % 8 == 0)
      out << endl << "  ";
    out << "0x" << std::setfill ('0') << std::setw (5) << tab[i].lc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
  }
  out.close ();

  in.clear ();
  in.seekg (0); //rewind
  tab.clear ();

  //Generate lower case -> upper case table
  while (in)
  {
    vector<string> fields;
    in.getline (line, sizeof (line));
    // printf ("%s\n", line);
    if (!strlen (line) || line[0] == '#' || line[0] == '\r')
      continue; //ignore empty and comment lines
    parse (line, fields);
    if (fields[UC_FIELD].empty ())
      continue;

    code.uc = strtol (fields[UC_FIELD].c_str (), nullptr, 16);
    code.lc = strtol (fields[CODE_FIELD].c_str (), nullptr, 16);
    code.descr = fields[DESCR_FIELD];
    tab.push_back (code);
  }

  out.open (string(argv[2]) + "/lowertab.h");
  out << "//Lower case table" << dec << endl
    << "static const char32_t l2u [" << tab.size () << "] = { " << endl;
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    out << "  0x" << std::setfill ('0') << std::setw (5) << tab[i].lc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
    out << "// " << tab[i].descr.c_str () << endl;
  }
  out << dec << endl;
  out << "//Upper case equivalents" << endl
    << "static const char32_t uc [" << tab.size () << "] = { " << endl;
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    if (i % 8 == 0)
      out << endl << "  ";
    out << "0x" << std::setfill ('0') << std::setw (5) << tab[i].uc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
  }
  out.close ();

  in.close ();
  return 0;
}